

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QCommandLineParserPrivate::PositionalArgumentDefinition>::reallocate
          (QMovableArrayOps<QCommandLineParserPrivate::PositionalArgumentDefinition> *this,
          qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<QCommandLineParserPrivate::PositionalArgumentDefinition>_*,_QCommandLineParserPrivate::PositionalArgumentDefinition_*>
  pVar1;
  
  pVar1 = QTypedArrayData<QCommandLineParserPrivate::PositionalArgumentDefinition>::
          reallocateUnaligned((this->
                              super_QGenericArrayOps<QCommandLineParserPrivate::PositionalArgumentDefinition>
                              ).
                              super_QArrayDataPointer<QCommandLineParserPrivate::PositionalArgumentDefinition>
                              .d,(this->
                                 super_QGenericArrayOps<QCommandLineParserPrivate::PositionalArgumentDefinition>
                                 ).
                                 super_QArrayDataPointer<QCommandLineParserPrivate::PositionalArgumentDefinition>
                                 .ptr,alloc,option);
  if (pVar1.second != (PositionalArgumentDefinition *)0x0) {
    (this->super_QGenericArrayOps<QCommandLineParserPrivate::PositionalArgumentDefinition>).
    super_QArrayDataPointer<QCommandLineParserPrivate::PositionalArgumentDefinition>.d = pVar1.first
    ;
    (this->super_QGenericArrayOps<QCommandLineParserPrivate::PositionalArgumentDefinition>).
    super_QArrayDataPointer<QCommandLineParserPrivate::PositionalArgumentDefinition>.ptr =
         pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }